

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laszip_dll.cpp
# Opt level: O1

laszip_I32 laszip_get_coordinates(laszip_POINTER pointer,laszip_F64 *coordinates)

{
  laszip_I32 lVar1;
  
  lVar1 = 1;
  if (pointer != (laszip_POINTER)0x0) {
    if (coordinates == (laszip_F64 *)0x0) {
      builtin_strncpy((char *)((long)pointer + 0x261),"inates\' ",8);
      builtin_strncpy((char *)((long)pointer + 0x269),"is zero",8);
      builtin_strncpy((char *)((long)pointer + 600),"er \'coor",8);
      builtin_strncpy((char *)((long)pointer + 0x260),"dinates\'",8);
      builtin_strncpy((char *)((long)pointer + 0x248),"laszip_F",8);
      builtin_strncpy((char *)((long)pointer + 0x250),"64 point",8);
      return lVar1;
    }
    *coordinates = (laszip_F64)
                   ((double)*(int *)((long)pointer + 0x1b0) * *(double *)((long)pointer + 0x80) +
                   *(double *)((long)pointer + 0x98));
    coordinates[1] =
         (laszip_F64)
         ((double)*(int *)((long)pointer + 0x1b4) * *(double *)((long)pointer + 0x88) +
         *(double *)((long)pointer + 0xa0));
    coordinates[2] =
         (laszip_F64)
         ((double)*(int *)((long)pointer + 0x1b8) * *(double *)((long)pointer + 0x90) +
         *(double *)((long)pointer + 0xa8));
    *(undefined1 *)((long)pointer + 0x248) = 0;
    lVar1 = 0;
  }
  return lVar1;
}

Assistant:

LASZIP_API laszip_I32
laszip_get_coordinates(
    laszip_POINTER                     pointer
    , laszip_F64*                      coordinates
)
{
  if (pointer == 0) return 1;
  laszip_dll_struct* laszip_dll = (laszip_dll_struct*)pointer;

  try
  {
    if (coordinates == 0)
    {
      snprintf(laszip_dll->error, sizeof(laszip_dll->error), "laszip_F64 pointer 'coordinates' is zero");
      return 1;
    }

    // get a pointer to the header

    laszip_header_struct* header = &(laszip_dll->header);

    // get a pointer to the point

    laszip_point_struct* point = &(laszip_dll->point);

    // get the coordinates

    coordinates[0] = header->x_scale_factor*point->X+header->x_offset;
    coordinates[1] = header->y_scale_factor*point->Y+header->y_offset;
    coordinates[2] = header->z_scale_factor*point->Z+header->z_offset;
  }
  catch (...)
  {
    snprintf(laszip_dll->error, sizeof(laszip_dll->error), "internal error in laszip_get_coordinates");
    return 1;
  }

  laszip_dll->error[0] = '\0';
  return 0;
}